

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
minja::Parser::unexpected(Parser *this,TemplateToken *token)

{
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Type in_stack_0000000c;
  size_t in_stack_00000270;
  string *in_stack_00000278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __rhs = in_RDI;
  TemplateToken::typeToString_abi_cxx11_(in_stack_0000000c);
  std::operator+(in_RSI,__rhs);
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__rhs);
  error_location_suffix(in_stack_00000278,in_stack_00000270);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::runtime_error::runtime_error((runtime_error *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  return __rhs;
}

Assistant:

std::runtime_error unexpected(const TemplateToken & token) const {
      return std::runtime_error("Unexpected " + TemplateToken::typeToString(token.type)
        + error_location_suffix(*template_str, token.location.pos));
    }